

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFunc.cpp
# Opt level: O2

void __thiscall
OpenMD::LegendreCorrFunc::LegendreCorrFunc
          (LegendreCorrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          int seleOffset,int order)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  string paramString;
  stringstream params;
  allocator<char> local_201;
  LegendrePolynomial local_200;
  string local_1d8 [32];
  undefined1 local_1b8 [392];
  
  ObjectACF<OpenMD::Vector3<double>_>::ObjectACF
            (&this->super_ObjectACF<OpenMD::Vector3<double>_>,info,filename,sele1,sele2);
  (this->super_ObjectACF<OpenMD::Vector3<double>_>).super_AutoCorrFunc<OpenMD::Vector3<double>_>.
  super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty._vptr_DynamicProperty =
       (_func_int **)&PTR__LegendreCorrFunc_002b67b8;
  this->order_ = order;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->legendre_).polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rotMats_).
  super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vectors_).
  super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->doOffset_ = true;
  this->seleOffset_ = seleOffset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Legendre Correlation Function",(allocator<char> *)&local_200);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.corrFuncType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix((string *)&local_200,
            &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
             super_AutoCorrFunc<OpenMD::Vector3<double>_>.
             super_TimeCorrFunc<OpenMD::Vector3<double>_>.dumpFilename_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_200,
                 ".lcorr");
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.super_DynamicProperty.outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10)," order = ");
  std::ostream::operator<<((ostream *)poVar2,this->order_);
  poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10)," seleoffset = ");
  std::ostream::operator<<((ostream *)poVar2,this->seleOffset_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.paramString_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Pn(costheta_x)\tPn(costheta_y)\tPn(costheta_z)",&local_201);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_ObjectACF<OpenMD::Vector3<double>_>).
              super_AutoCorrFunc<OpenMD::Vector3<double>_>.
              super_TimeCorrFunc<OpenMD::Vector3<double>_>.labelString_);
  std::__cxx11::string::~string((string *)&local_200);
  LegendrePolynomial::LegendrePolynomial(&local_200,order);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&this->legendre_,
              (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)(local_200.polyList_.
                  super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + order));
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize(&this->vectors_,
           (long)(this->super_ObjectACF<OpenMD::Vector3<double>_>).
                 super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                 super_TimeCorrFunc<OpenMD::Vector3<double>_>.nFrames_);
  LegendrePolynomial::~LegendrePolynomial(&local_200);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

LegendreCorrFunc::LegendreCorrFunc(SimInfo* info, const std::string& filename,
                                     const std::string& sele1,
                                     const std::string& sele2,
				     int seleOffset,
				     int order) :
    ObjectACF<Vector3d>(info, filename, sele1, sele2), doOffset_(true),
    seleOffset_(seleOffset), order_(order) {
    setCorrFuncType("Legendre Correlation Function");
    setOutputName(getPrefix(dumpFilename_) + ".lcorr");

    std::stringstream params;
    params << " order = " << order_;
    params << " seleoffset = " << seleOffset_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    setLabelString("Pn(costheta_x)\tPn(costheta_y)\tPn(costheta_z)");

    LegendrePolynomial polynomial(order);
    legendre_ = polynomial.getLegendrePolynomial(order);

    vectors_.resize(nFrames_);
  }